

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOListener.cpp
# Opt level: O1

void __thiscall mognetwork::TcpASIOListener::start(TcpASIOListener *this)

{
  SocketFD fd;
  
  fd = Socket::getSocketFD((Socket *)this->m_serverSocket);
  Selector::addFdToRead(&this->m_selector,fd);
  Selector::addFdToRead(&this->m_selector,this->m_pipefd[0]);
  (*this->m_thread->_vptr_Thread[2])();
  return;
}

Assistant:

void TcpASIOListener::start()
  {
    m_selector.addFdToRead(m_serverSocket.getSocketFD());
#ifndef OS_WINDOWS
	//TODO Find a solution for windows
	m_selector.addFdToRead(m_pipefd[0]);
#endif // !OS_WINDOWS
    m_thread->start();
  }